

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_fma_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar125;
  float fVar126;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  int local_3b44;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  int local_3ad8;
  undefined8 *local_3ac8;
  uint *local_3ac0;
  undefined1 (*local_3ab8) [32];
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  float local_3700;
  float fStack_36fc;
  float fStack_36f8;
  float fStack_36f4;
  float fStack_36f0;
  float fStack_36ec;
  float fStack_36e8;
  float fStack_36e4;
  float local_36e0;
  float fStack_36dc;
  float fStack_36d8;
  float fStack_36d4;
  float fStack_36d0;
  float fStack_36cc;
  float fStack_36c8;
  float fStack_36c4;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  float local_3000;
  float fStack_2ffc;
  float fStack_2ff8;
  float fStack_2ff4;
  float fStack_2ff0;
  float fStack_2fec;
  float fStack_2fe8;
  float fStack_2fe4;
  float local_2fe0;
  float fStack_2fdc;
  float fStack_2fd8;
  float fStack_2fd4;
  float fStack_2fd0;
  float fStack_2fcc;
  float fStack_2fc8;
  float fStack_2fc4;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  float fStack_2744;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  float local_2380;
  float fStack_237c;
  float fStack_2378;
  float fStack_2374;
  float local_2300;
  float fStack_22fc;
  float fStack_22f8;
  float fStack_22f4;
  float fStack_22f0;
  float fStack_22ec;
  float fStack_22e8;
  float fStack_22e4;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  uint local_dc0;
  uint uStack_dbc;
  uint uStack_db8;
  uint uStack_db4;
  uint uStack_db0;
  uint uStack_dac;
  uint uStack_da8;
  uint uStack_da4;
  uint local_d00;
  uint uStack_cfc;
  uint uStack_cf8;
  uint uStack_cf4;
  uint uStack_cf0;
  uint uStack_cec;
  uint uStack_ce8;
  uint uStack_ce4;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  
  local_3ac8 = in_RDX;
  local_3ac0 = in_RSI;
  local_3ab8 = in_RDI;
  if (in_R8D == 8) {
    for (local_3ad8 = 0; local_3ad8 < in_ECX; local_3ad8 = local_3ad8 + 1) {
      uVar1 = *local_3ac0;
      auVar13 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x30);
      auVar14 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x30);
      uStack_3970 = auVar14._0_8_;
      uStack_3968 = auVar14._8_8_;
      auVar73._16_8_ = uStack_3970;
      auVar73._0_16_ = auVar13;
      auVar73._24_8_ = uStack_3968;
      auVar72._16_8_ = uStack_3970;
      auVar72._0_16_ = auVar13;
      auVar72._24_8_ = uStack_3968;
      auVar71._16_8_ = uStack_3970;
      auVar71._0_16_ = auVar13;
      auVar71._24_8_ = uStack_3968;
      auVar7._16_8_ = uStack_3970;
      auVar7._0_16_ = auVar13;
      auVar7._24_8_ = uStack_3968;
      auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
      auVar14 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x30);
      uStack_3690 = auVar14._0_8_;
      uStack_3688 = auVar14._8_8_;
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
      uStack_3650 = auVar15._0_8_;
      uStack_3648 = auVar15._8_8_;
      auVar15 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
      uStack_3610 = auVar16._0_8_;
      uStack_3608 = auVar16._8_8_;
      auVar16 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
      uStack_35d0 = auVar17._0_8_;
      uStack_35c8 = auVar17._8_8_;
      auVar6._16_8_ = uStack_3690;
      auVar6._0_16_ = auVar13;
      auVar6._24_8_ = uStack_3688;
      auVar6 = vcmpps_avx(auVar7,auVar6,4);
      auVar2._16_8_ = uStack_3690;
      auVar2._0_16_ = auVar13;
      auVar2._24_8_ = uStack_3688;
      auVar7 = vcmpps_avx(*local_3ab8,auVar2,4);
      auVar6 = vandps_avx(auVar6,auVar7);
      auVar10._16_8_ = uStack_3650;
      auVar10._0_16_ = auVar14;
      auVar10._24_8_ = uStack_3648;
      auVar2 = vandps_avx(auVar10,auVar71);
      auVar5._16_8_ = uStack_3650;
      auVar5._0_16_ = auVar14;
      auVar5._24_8_ = uStack_3648;
      auVar3 = vandps_avx(auVar5,*local_3ab8);
      auVar9._16_8_ = uStack_3690;
      auVar9._0_16_ = auVar13;
      auVar9._24_8_ = uStack_3688;
      auVar8 = vcmpps_avx(auVar72,auVar9,1);
      auVar9 = vcmpps_avx(*local_3ab8,auVar9,1);
      auVar4._16_8_ = uStack_3650;
      auVar4._0_16_ = auVar14;
      auVar4._24_8_ = uStack_3648;
      auVar9 = vandps_avx(auVar9,auVar4);
      auVar35._16_8_ = uStack_3610;
      auVar35._0_16_ = auVar15;
      auVar35._24_8_ = uStack_3608;
      auVar9 = vorps_avx(auVar9,auVar35);
      auVar9 = vandps_avx(auVar8,auVar9);
      auVar12 = vdivps_avx(*local_3ab8,auVar73);
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x30);
      uStack_1910 = auVar17._0_8_;
      uStack_1908 = auVar17._8_8_;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      uStack_18d0 = auVar18._0_8_;
      uStack_18c8 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
      uStack_1890 = auVar19._0_8_;
      uStack_1888 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      uStack_1850 = auVar20._0_8_;
      uStack_1848 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      uStack_1810 = auVar21._0_8_;
      uStack_1808 = auVar21._8_8_;
      auVar21 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0xbeaaaa53),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0xbeaaaa53),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x30);
      uStack_17d0 = auVar22._0_8_;
      uStack_17c8 = auVar22._8_8_;
      auVar22 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3e4cb974),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3e4cb974),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3e4cb974),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3e4cb974),0x30);
      uStack_1790 = auVar23._0_8_;
      uStack_1788 = auVar23._8_8_;
      auVar23 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbe117200),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbe117200),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbe117200),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbe117200),0x30);
      uStack_1750 = auVar24._0_8_;
      uStack_1748 = auVar24._8_8_;
      auVar24 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3dd9ed24),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3dd9ed24),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3dd9ed24),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3dd9ed24),0x30);
      uStack_1710 = auVar25._0_8_;
      uStack_1708 = auVar25._8_8_;
      auVar25 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbd99b01e),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbd99b01e),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbd99b01e),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbd99b01e),0x30);
      uStack_16d0 = auVar26._0_8_;
      uStack_16c8 = auVar26._8_8_;
      auVar26 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3d2edd4e),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3d2edd4e),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3d2edd4e),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3d2edd4e),0x30);
      uStack_1690 = auVar27._0_8_;
      uStack_1688 = auVar27._8_8_;
      auVar27 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbc83a25c),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbc83a25c),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbc83a25c),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbc83a25c),0x30);
      uStack_1650 = auVar28._0_8_;
      uStack_1648 = auVar28._8_8_;
      auVar28 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3b3ac537),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3b3ac537),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3b3ac537),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3b3ac537),0x30);
      uStack_1610 = auVar29._0_8_;
      uStack_1608 = auVar29._8_8_;
      auVar56._16_8_ = uStack_1910;
      auVar56._0_16_ = auVar14;
      auVar56._24_8_ = uStack_1908;
      auVar8 = vandps_avx(auVar56,auVar12);
      auVar59._16_8_ = uStack_1910;
      auVar59._0_16_ = auVar14;
      auVar59._24_8_ = uStack_1908;
      auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar4 = vandnps_avx(auVar59,auVar12);
      auVar53._16_8_ = uStack_18d0;
      auVar53._0_16_ = auVar17;
      auVar53._24_8_ = uStack_18c8;
      auVar11 = vcmpps_avx(auVar53,auVar4,1);
      auVar55._16_8_ = uStack_1890;
      auVar55._0_16_ = auVar18;
      auVar55._24_8_ = uStack_1888;
      auVar12 = vandps_avx(auVar11,auVar55);
      auVar5 = vandnps_avx(auVar11,auVar4);
      auVar5 = vorps_avx(auVar12,auVar5);
      auVar12 = vandps_avx(auVar11,auVar4);
      auVar58._16_8_ = uStack_18d0;
      auVar58._0_16_ = auVar17;
      auVar58._24_8_ = uStack_18c8;
      auVar4 = vandnps_avx(auVar11,auVar58);
      auVar12 = vorps_avx(auVar12,auVar4);
      auVar12 = vdivps_avx(auVar5,auVar12);
      local_1540 = auVar12._0_4_;
      fStack_153c = auVar12._4_4_;
      fStack_1538 = auVar12._8_4_;
      fStack_1534 = auVar12._12_4_;
      fStack_1530 = auVar12._16_4_;
      fStack_152c = auVar12._20_4_;
      fStack_1528 = auVar12._24_4_;
      fStack_1524 = auVar12._28_4_;
      fVar125 = local_1540 * local_1540;
      fVar129 = fStack_153c * fStack_153c;
      fVar131 = fStack_1538 * fStack_1538;
      fVar133 = fStack_1534 * fStack_1534;
      fVar135 = fStack_1530 * fStack_1530;
      fVar137 = fStack_152c * fStack_152c;
      fVar139 = fStack_1528 * fStack_1528;
      fVar126 = fVar125 * fVar125;
      fVar130 = fVar129 * fVar129;
      fVar132 = fVar131 * fVar131;
      fVar134 = fVar133 * fVar133;
      fVar136 = fVar135 * fVar135;
      fVar138 = fVar137 * fVar137;
      fVar140 = fVar139 * fVar139;
      auVar91._4_4_ = fVar130;
      auVar91._0_4_ = fVar126;
      auVar91._8_4_ = fVar132;
      auVar91._12_4_ = fVar134;
      auVar91._16_4_ = fVar136;
      auVar91._20_4_ = fVar138;
      auVar91._24_4_ = fVar140;
      auVar91._28_4_ = fStack_1524;
      auVar100._16_8_ = uStack_1650;
      auVar100._0_16_ = auVar27;
      auVar100._24_8_ = uStack_1648;
      auVar102._16_8_ = uStack_16d0;
      auVar102._0_16_ = auVar25;
      auVar102._24_8_ = uStack_16c8;
      auVar14 = vfmadd213ps_fma(auVar100,auVar91,auVar102);
      auVar92._4_4_ = fVar130;
      auVar92._0_4_ = fVar126;
      auVar92._8_4_ = fVar132;
      auVar92._12_4_ = fVar134;
      auVar92._16_4_ = fVar136;
      auVar92._20_4_ = fVar138;
      auVar92._24_4_ = fVar140;
      auVar92._28_4_ = fStack_1524;
      auVar104._16_8_ = uStack_1750;
      auVar104._0_16_ = auVar23;
      auVar104._24_8_ = uStack_1748;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar92,auVar104);
      auVar93._4_4_ = fVar130;
      auVar93._0_4_ = fVar126;
      auVar93._8_4_ = fVar132;
      auVar93._12_4_ = fVar134;
      auVar93._16_4_ = fVar136;
      auVar93._20_4_ = fVar138;
      auVar93._24_4_ = fVar140;
      auVar93._28_4_ = fStack_1524;
      auVar106._16_8_ = uStack_17d0;
      auVar106._0_16_ = auVar21;
      auVar106._24_8_ = uStack_17c8;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar93,auVar106);
      auVar94._4_4_ = fVar130;
      auVar94._0_4_ = fVar126;
      auVar94._8_4_ = fVar132;
      auVar94._12_4_ = fVar134;
      auVar94._16_4_ = fVar136;
      auVar94._20_4_ = fVar138;
      auVar94._24_4_ = fVar140;
      auVar94._28_4_ = fStack_1524;
      auVar99._16_8_ = uStack_1610;
      auVar99._0_16_ = auVar28;
      auVar99._24_8_ = uStack_1608;
      auVar101._16_8_ = uStack_1690;
      auVar101._0_16_ = auVar26;
      auVar101._24_8_ = uStack_1688;
      auVar17 = vfmadd213ps_fma(auVar99,auVar94,auVar101);
      auVar95._4_4_ = fVar130;
      auVar95._0_4_ = fVar126;
      auVar95._8_4_ = fVar132;
      auVar95._12_4_ = fVar134;
      auVar95._16_4_ = fVar136;
      auVar95._20_4_ = fVar138;
      auVar95._24_4_ = fVar140;
      auVar95._28_4_ = fStack_1524;
      auVar103._16_8_ = uStack_1710;
      auVar103._0_16_ = auVar24;
      auVar103._24_8_ = uStack_1708;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar95,auVar103);
      auVar96._4_4_ = fVar130;
      auVar96._0_4_ = fVar126;
      auVar96._8_4_ = fVar132;
      auVar96._12_4_ = fVar134;
      auVar96._16_4_ = fVar136;
      auVar96._20_4_ = fVar138;
      auVar96._24_4_ = fVar140;
      auVar96._28_4_ = fStack_1524;
      auVar105._16_8_ = uStack_1790;
      auVar105._0_16_ = auVar22;
      auVar105._24_8_ = uStack_1788;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar96,auVar105);
      auVar97._4_4_ = fVar130;
      auVar97._0_4_ = fVar126;
      auVar97._8_4_ = fVar132;
      auVar97._12_4_ = fVar134;
      auVar97._16_4_ = fVar136;
      auVar97._20_4_ = fVar138;
      auVar97._24_4_ = fVar140;
      auVar97._28_4_ = fStack_1524;
      auVar107._16_8_ = uStack_1810;
      auVar107._0_16_ = auVar20;
      auVar107._24_8_ = uStack_1808;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar97,auVar107);
      auVar98._4_4_ = fVar129;
      auVar98._0_4_ = fVar125;
      auVar98._8_4_ = fVar131;
      auVar98._12_4_ = fVar133;
      auVar98._16_4_ = fVar135;
      auVar98._20_4_ = fVar137;
      auVar98._24_4_ = fVar139;
      auVar98._28_4_ = fStack_1524;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar98,ZEXT1632(auVar17));
      local_15c0 = auVar14._0_4_;
      fStack_15bc = auVar14._4_4_;
      fStack_15b8 = auVar14._8_4_;
      fStack_15b4 = auVar14._12_4_;
      auVar54._16_8_ = uStack_1850;
      auVar54._0_16_ = auVar19;
      auVar54._24_8_ = uStack_1848;
      auVar12 = vandps_avx(auVar11,auVar54);
      local_19a0 = auVar12._0_4_;
      fStack_199c = auVar12._4_4_;
      fStack_1998 = auVar12._8_4_;
      fStack_1994 = auVar12._12_4_;
      fStack_1990 = auVar12._16_4_;
      fStack_198c = auVar12._20_4_;
      fStack_1988 = auVar12._24_4_;
      fStack_1984 = auVar12._28_4_;
      auVar57._4_4_ = fStack_15bc * fStack_153c + fStack_199c;
      auVar57._0_4_ = local_15c0 * local_1540 + local_19a0;
      auVar57._8_4_ = fStack_15b8 * fStack_1538 + fStack_1998;
      auVar57._12_4_ = fStack_15b4 * fStack_1534 + fStack_1994;
      auVar57._16_4_ = fStack_1530 * 0.0 + fStack_1990;
      auVar57._20_4_ = fStack_152c * 0.0 + fStack_198c;
      auVar57._24_4_ = fStack_1528 * 0.0 + fStack_1988;
      auVar57._28_4_ = fStack_1524 + fStack_1984;
      auVar8 = vorps_avx(auVar57,auVar8);
      local_36e0 = auVar8._0_4_;
      fStack_36dc = auVar8._4_4_;
      fStack_36d8 = auVar8._8_4_;
      fStack_36d4 = auVar8._12_4_;
      fStack_36d0 = auVar8._16_4_;
      fStack_36cc = auVar8._20_4_;
      fStack_36c8 = auVar8._24_4_;
      fStack_36c4 = auVar8._28_4_;
      local_3700 = auVar9._0_4_;
      fStack_36fc = auVar9._4_4_;
      fStack_36f8 = auVar9._8_4_;
      fStack_36f4 = auVar9._12_4_;
      fStack_36f0 = auVar9._16_4_;
      fStack_36ec = auVar9._20_4_;
      fStack_36e8 = auVar9._24_4_;
      fStack_36e4 = auVar9._28_4_;
      auVar34._16_8_ = uStack_3610;
      auVar34._0_16_ = auVar15;
      auVar34._24_8_ = uStack_3608;
      auVar2 = vorps_avx(auVar2,auVar34);
      auVar8._16_8_ = uStack_3690;
      auVar8._0_16_ = auVar13;
      auVar8._24_8_ = uStack_3688;
      auVar9 = vcmpps_avx(auVar2,auVar8,1);
      auVar11._16_8_ = uStack_35d0;
      auVar11._0_16_ = auVar16;
      auVar11._24_8_ = uStack_35c8;
      auVar2 = vorps_avx(auVar3,auVar11);
      auVar2 = vandps_avx(auVar7,auVar2);
      auVar3._16_8_ = uStack_3610;
      auVar3._0_16_ = auVar15;
      auVar3._24_8_ = uStack_3608;
      auVar3 = vandps_avx(auVar9,auVar3);
      auVar63._16_8_ = uStack_3690;
      auVar63._0_16_ = auVar13;
      auVar63._24_8_ = uStack_3688;
      auVar9 = vandnps_avx(auVar9,auVar63);
      auVar3 = vorps_avx(auVar3,auVar9);
      auVar3 = vandnps_avx(auVar7,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar12._4_4_ = fStack_36dc + fStack_36fc;
      auVar12._0_4_ = local_36e0 + local_3700;
      auVar12._12_4_ = fStack_36d4 + fStack_36f4;
      auVar12._8_4_ = fStack_36d8 + fStack_36f8;
      auVar12._20_4_ = fStack_36cc + fStack_36ec;
      auVar12._16_4_ = fStack_36d0 + fStack_36f0;
      auVar12._28_4_ = fStack_36c4 + fStack_36e4;
      auVar12._24_4_ = fStack_36c8 + fStack_36e8;
      auVar2 = vandps_avx(auVar6,auVar12);
      local_d00 = auVar6._0_4_;
      uStack_cfc = auVar6._4_4_;
      uStack_cf8 = auVar6._8_4_;
      uStack_cf4 = auVar6._12_4_;
      uStack_cf0 = auVar6._16_4_;
      uStack_cec = auVar6._20_4_;
      uStack_ce8 = auVar6._24_4_;
      uStack_ce4 = auVar6._28_4_;
      auVar127._0_4_ = local_d00 ^ auVar10._0_4_;
      auVar127._4_4_ = uStack_cfc ^ auVar10._4_4_;
      auVar127._8_4_ = uStack_cf8 ^ auVar10._8_4_;
      auVar127._12_4_ = uStack_cf4 ^ auVar10._12_4_;
      auVar127._16_4_ = uStack_cf0 ^ auVar10._16_4_;
      auVar127._20_4_ = uStack_cec ^ auVar10._20_4_;
      auVar127._24_4_ = uStack_ce8 ^ auVar10._24_4_;
      auVar127._28_4_ = uStack_ce4 ^ auVar10._28_4_;
      auVar6 = vandps_avx(auVar127,auVar3);
      auVar6 = vorps_avx(auVar2,auVar6);
      local_3b40 = auVar6._0_8_;
      uStack_3b38 = auVar6._8_8_;
      uStack_3b30 = auVar6._16_8_;
      uStack_3b28 = auVar6._24_8_;
      *local_3ac8 = local_3b40;
      local_3ac8[1] = uStack_3b38;
      local_3ac8[2] = uStack_3b30;
      local_3ac8[3] = uStack_3b28;
      local_3ab8 = local_3ab8 + 1;
      local_3ac0 = local_3ac0 + 1;
      local_3ac8 = local_3ac8 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_3b44 = 0; local_3b44 + 1 < in_ECX; local_3b44 = local_3b44 + 2) {
      uVar1 = *local_3ac0;
      uVar32 = CONCAT44(uVar1,uVar1);
      uVar33 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3ac0[1];
      uVar30 = CONCAT44(uVar1,uVar1);
      uVar31 = CONCAT44(uVar1,uVar1);
      auVar70._8_8_ = uVar33;
      auVar70._0_8_ = uVar32;
      auVar70._16_8_ = uVar30;
      auVar70._24_8_ = uVar31;
      auVar69._8_8_ = uVar33;
      auVar69._0_8_ = uVar32;
      auVar69._16_8_ = uVar30;
      auVar69._24_8_ = uVar31;
      auVar68._8_8_ = uVar33;
      auVar68._0_8_ = uVar32;
      auVar68._16_8_ = uVar30;
      auVar68._24_8_ = uVar31;
      auVar67._8_8_ = uVar33;
      auVar67._0_8_ = uVar32;
      auVar67._16_8_ = uVar30;
      auVar67._24_8_ = uVar31;
      auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
      auVar14 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x30);
      uStack_2f90 = auVar14._0_8_;
      uStack_2f88 = auVar14._8_8_;
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
      uStack_2f50 = auVar15._0_8_;
      uStack_2f48 = auVar15._8_8_;
      auVar15 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
      uStack_2f10 = auVar16._0_8_;
      uStack_2f08 = auVar16._8_8_;
      auVar16 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
      uStack_2ed0 = auVar17._0_8_;
      uStack_2ec8 = auVar17._8_8_;
      auVar36._16_8_ = uStack_2f90;
      auVar36._0_16_ = auVar13;
      auVar36._24_8_ = uStack_2f88;
      auVar6 = vcmpps_avx(auVar67,auVar36,4);
      auVar37._16_8_ = uStack_2f90;
      auVar37._0_16_ = auVar13;
      auVar37._24_8_ = uStack_2f88;
      auVar7 = vcmpps_avx(*local_3ab8,auVar37,4);
      auVar6 = vandps_avx(auVar6,auVar7);
      auVar44._16_8_ = uStack_2f50;
      auVar44._0_16_ = auVar14;
      auVar44._24_8_ = uStack_2f48;
      auVar2 = vandps_avx(auVar44,auVar68);
      auVar43._16_8_ = uStack_2f50;
      auVar43._0_16_ = auVar14;
      auVar43._24_8_ = uStack_2f48;
      auVar3 = vandps_avx(auVar43,*local_3ab8);
      auVar38._16_8_ = uStack_2f90;
      auVar38._0_16_ = auVar13;
      auVar38._24_8_ = uStack_2f88;
      auVar8 = vcmpps_avx(auVar69,auVar38,1);
      auVar9 = vcmpps_avx(*local_3ab8,auVar38,1);
      auVar42._16_8_ = uStack_2f50;
      auVar42._0_16_ = auVar14;
      auVar42._24_8_ = uStack_2f48;
      auVar9 = vandps_avx(auVar9,auVar42);
      auVar47._16_8_ = uStack_2f10;
      auVar47._0_16_ = auVar15;
      auVar47._24_8_ = uStack_2f08;
      auVar9 = vorps_avx(auVar9,auVar47);
      auVar9 = vandps_avx(auVar8,auVar9);
      auVar12 = vdivps_avx(*local_3ab8,auVar70);
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x30);
      uStack_26d0 = auVar17._0_8_;
      uStack_26c8 = auVar17._8_8_;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      uStack_2690 = auVar18._0_8_;
      uStack_2688 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
      uStack_2650 = auVar19._0_8_;
      uStack_2648 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      uStack_2610 = auVar20._0_8_;
      uStack_2608 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      uStack_25d0 = auVar21._0_8_;
      uStack_25c8 = auVar21._8_8_;
      auVar21 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0xbeaaaa53),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0xbeaaaa53),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x30);
      uStack_2590 = auVar22._0_8_;
      uStack_2588 = auVar22._8_8_;
      auVar22 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3e4cb974),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3e4cb974),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3e4cb974),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3e4cb974),0x30);
      uStack_2550 = auVar23._0_8_;
      uStack_2548 = auVar23._8_8_;
      auVar23 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbe117200),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbe117200),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbe117200),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbe117200),0x30);
      uStack_2510 = auVar24._0_8_;
      uStack_2508 = auVar24._8_8_;
      auVar24 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3dd9ed24),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3dd9ed24),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3dd9ed24),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3dd9ed24),0x30);
      uStack_24d0 = auVar25._0_8_;
      uStack_24c8 = auVar25._8_8_;
      auVar25 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbd99b01e),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbd99b01e),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbd99b01e),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbd99b01e),0x30);
      uStack_2490 = auVar26._0_8_;
      uStack_2488 = auVar26._8_8_;
      auVar26 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3d2edd4e),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3d2edd4e),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3d2edd4e),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3d2edd4e),0x30);
      uStack_2450 = auVar27._0_8_;
      uStack_2448 = auVar27._8_8_;
      auVar27 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbc83a25c),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbc83a25c),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbc83a25c),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbc83a25c),0x30);
      uStack_2410 = auVar28._0_8_;
      uStack_2408 = auVar28._8_8_;
      auVar28 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3b3ac537),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3b3ac537),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3b3ac537),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3b3ac537),0x30);
      uStack_23d0 = auVar29._0_8_;
      uStack_23c8 = auVar29._8_8_;
      auVar51._16_8_ = uStack_26d0;
      auVar51._0_16_ = auVar14;
      auVar51._24_8_ = uStack_26c8;
      auVar8 = vandps_avx(auVar51,auVar12);
      auVar61._16_8_ = uStack_26d0;
      auVar61._0_16_ = auVar14;
      auVar61._24_8_ = uStack_26c8;
      auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar4 = vandnps_avx(auVar61,auVar12);
      auVar48._16_8_ = uStack_2690;
      auVar48._0_16_ = auVar17;
      auVar48._24_8_ = uStack_2688;
      auVar11 = vcmpps_avx(auVar48,auVar4,1);
      auVar50._16_8_ = uStack_2650;
      auVar50._0_16_ = auVar18;
      auVar50._24_8_ = uStack_2648;
      auVar12 = vandps_avx(auVar11,auVar50);
      auVar5 = vandnps_avx(auVar11,auVar4);
      auVar5 = vorps_avx(auVar12,auVar5);
      auVar12 = vandps_avx(auVar11,auVar4);
      auVar60._16_8_ = uStack_2690;
      auVar60._0_16_ = auVar17;
      auVar60._24_8_ = uStack_2688;
      auVar4 = vandnps_avx(auVar11,auVar60);
      auVar12 = vorps_avx(auVar12,auVar4);
      auVar12 = vdivps_avx(auVar5,auVar12);
      local_2300 = auVar12._0_4_;
      fStack_22fc = auVar12._4_4_;
      fStack_22f8 = auVar12._8_4_;
      fStack_22f4 = auVar12._12_4_;
      fStack_22f0 = auVar12._16_4_;
      fStack_22ec = auVar12._20_4_;
      fStack_22e8 = auVar12._24_4_;
      fStack_22e4 = auVar12._28_4_;
      fVar125 = local_2300 * local_2300;
      fVar129 = fStack_22fc * fStack_22fc;
      fVar131 = fStack_22f8 * fStack_22f8;
      fVar133 = fStack_22f4 * fStack_22f4;
      fVar135 = fStack_22f0 * fStack_22f0;
      fVar137 = fStack_22ec * fStack_22ec;
      fVar139 = fStack_22e8 * fStack_22e8;
      fVar126 = fVar125 * fVar125;
      fVar130 = fVar129 * fVar129;
      fVar132 = fVar131 * fVar131;
      fVar134 = fVar133 * fVar133;
      fVar136 = fVar135 * fVar135;
      fVar138 = fVar137 * fVar137;
      fVar140 = fVar139 * fVar139;
      auVar74._4_4_ = fVar130;
      auVar74._0_4_ = fVar126;
      auVar74._8_4_ = fVar132;
      auVar74._12_4_ = fVar134;
      auVar74._16_4_ = fVar136;
      auVar74._20_4_ = fVar138;
      auVar74._24_4_ = fVar140;
      auVar74._28_4_ = fStack_22e4;
      auVar83._16_8_ = uStack_2410;
      auVar83._0_16_ = auVar27;
      auVar83._24_8_ = uStack_2408;
      auVar85._16_8_ = uStack_2490;
      auVar85._0_16_ = auVar25;
      auVar85._24_8_ = uStack_2488;
      auVar14 = vfmadd213ps_fma(auVar83,auVar74,auVar85);
      auVar75._4_4_ = fVar130;
      auVar75._0_4_ = fVar126;
      auVar75._8_4_ = fVar132;
      auVar75._12_4_ = fVar134;
      auVar75._16_4_ = fVar136;
      auVar75._20_4_ = fVar138;
      auVar75._24_4_ = fVar140;
      auVar75._28_4_ = fStack_22e4;
      auVar87._16_8_ = uStack_2510;
      auVar87._0_16_ = auVar23;
      auVar87._24_8_ = uStack_2508;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar75,auVar87);
      auVar76._4_4_ = fVar130;
      auVar76._0_4_ = fVar126;
      auVar76._8_4_ = fVar132;
      auVar76._12_4_ = fVar134;
      auVar76._16_4_ = fVar136;
      auVar76._20_4_ = fVar138;
      auVar76._24_4_ = fVar140;
      auVar76._28_4_ = fStack_22e4;
      auVar89._16_8_ = uStack_2590;
      auVar89._0_16_ = auVar21;
      auVar89._24_8_ = uStack_2588;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar76,auVar89);
      auVar77._4_4_ = fVar130;
      auVar77._0_4_ = fVar126;
      auVar77._8_4_ = fVar132;
      auVar77._12_4_ = fVar134;
      auVar77._16_4_ = fVar136;
      auVar77._20_4_ = fVar138;
      auVar77._24_4_ = fVar140;
      auVar77._28_4_ = fStack_22e4;
      auVar82._16_8_ = uStack_23d0;
      auVar82._0_16_ = auVar28;
      auVar82._24_8_ = uStack_23c8;
      auVar84._16_8_ = uStack_2450;
      auVar84._0_16_ = auVar26;
      auVar84._24_8_ = uStack_2448;
      auVar17 = vfmadd213ps_fma(auVar82,auVar77,auVar84);
      auVar78._4_4_ = fVar130;
      auVar78._0_4_ = fVar126;
      auVar78._8_4_ = fVar132;
      auVar78._12_4_ = fVar134;
      auVar78._16_4_ = fVar136;
      auVar78._20_4_ = fVar138;
      auVar78._24_4_ = fVar140;
      auVar78._28_4_ = fStack_22e4;
      auVar86._16_8_ = uStack_24d0;
      auVar86._0_16_ = auVar24;
      auVar86._24_8_ = uStack_24c8;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar78,auVar86);
      auVar79._4_4_ = fVar130;
      auVar79._0_4_ = fVar126;
      auVar79._8_4_ = fVar132;
      auVar79._12_4_ = fVar134;
      auVar79._16_4_ = fVar136;
      auVar79._20_4_ = fVar138;
      auVar79._24_4_ = fVar140;
      auVar79._28_4_ = fStack_22e4;
      auVar88._16_8_ = uStack_2550;
      auVar88._0_16_ = auVar22;
      auVar88._24_8_ = uStack_2548;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar79,auVar88);
      auVar80._4_4_ = fVar130;
      auVar80._0_4_ = fVar126;
      auVar80._8_4_ = fVar132;
      auVar80._12_4_ = fVar134;
      auVar80._16_4_ = fVar136;
      auVar80._20_4_ = fVar138;
      auVar80._24_4_ = fVar140;
      auVar80._28_4_ = fStack_22e4;
      auVar90._16_8_ = uStack_25d0;
      auVar90._0_16_ = auVar20;
      auVar90._24_8_ = uStack_25c8;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar80,auVar90);
      auVar81._4_4_ = fVar129;
      auVar81._0_4_ = fVar125;
      auVar81._8_4_ = fVar131;
      auVar81._12_4_ = fVar133;
      auVar81._16_4_ = fVar135;
      auVar81._20_4_ = fVar137;
      auVar81._24_4_ = fVar139;
      auVar81._28_4_ = fStack_22e4;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar81,ZEXT1632(auVar17));
      local_2380 = auVar14._0_4_;
      fStack_237c = auVar14._4_4_;
      fStack_2378 = auVar14._8_4_;
      fStack_2374 = auVar14._12_4_;
      auVar49._16_8_ = uStack_2610;
      auVar49._0_16_ = auVar19;
      auVar49._24_8_ = uStack_2608;
      auVar12 = vandps_avx(auVar11,auVar49);
      local_2760 = auVar12._0_4_;
      fStack_275c = auVar12._4_4_;
      fStack_2758 = auVar12._8_4_;
      fStack_2754 = auVar12._12_4_;
      fStack_2750 = auVar12._16_4_;
      fStack_274c = auVar12._20_4_;
      fStack_2748 = auVar12._24_4_;
      fStack_2744 = auVar12._28_4_;
      auVar52._4_4_ = fStack_237c * fStack_22fc + fStack_275c;
      auVar52._0_4_ = local_2380 * local_2300 + local_2760;
      auVar52._8_4_ = fStack_2378 * fStack_22f8 + fStack_2758;
      auVar52._12_4_ = fStack_2374 * fStack_22f4 + fStack_2754;
      auVar52._16_4_ = fStack_22f0 * 0.0 + fStack_2750;
      auVar52._20_4_ = fStack_22ec * 0.0 + fStack_274c;
      auVar52._24_4_ = fStack_22e8 * 0.0 + fStack_2748;
      auVar52._28_4_ = fStack_22e4 + fStack_2744;
      auVar8 = vorps_avx(auVar52,auVar8);
      local_2fe0 = auVar8._0_4_;
      fStack_2fdc = auVar8._4_4_;
      fStack_2fd8 = auVar8._8_4_;
      fStack_2fd4 = auVar8._12_4_;
      fStack_2fd0 = auVar8._16_4_;
      fStack_2fcc = auVar8._20_4_;
      fStack_2fc8 = auVar8._24_4_;
      fStack_2fc4 = auVar8._28_4_;
      local_3000 = auVar9._0_4_;
      fStack_2ffc = auVar9._4_4_;
      fStack_2ff8 = auVar9._8_4_;
      fStack_2ff4 = auVar9._12_4_;
      fStack_2ff0 = auVar9._16_4_;
      fStack_2fec = auVar9._20_4_;
      fStack_2fe8 = auVar9._24_4_;
      fStack_2fe4 = auVar9._28_4_;
      auVar46._16_8_ = uStack_2f10;
      auVar46._0_16_ = auVar15;
      auVar46._24_8_ = uStack_2f08;
      auVar2 = vorps_avx(auVar2,auVar46);
      auVar39._16_8_ = uStack_2f90;
      auVar39._0_16_ = auVar13;
      auVar39._24_8_ = uStack_2f88;
      auVar9 = vcmpps_avx(auVar2,auVar39,1);
      auVar45._16_8_ = uStack_2ed0;
      auVar45._0_16_ = auVar16;
      auVar45._24_8_ = uStack_2ec8;
      auVar2 = vorps_avx(auVar3,auVar45);
      auVar2 = vandps_avx(auVar7,auVar2);
      auVar41._16_8_ = uStack_2f10;
      auVar41._0_16_ = auVar15;
      auVar41._24_8_ = uStack_2f08;
      auVar3 = vandps_avx(auVar9,auVar41);
      auVar62._16_8_ = uStack_2f90;
      auVar62._0_16_ = auVar13;
      auVar62._24_8_ = uStack_2f88;
      auVar9 = vandnps_avx(auVar9,auVar62);
      auVar3 = vorps_avx(auVar3,auVar9);
      auVar3 = vandnps_avx(auVar7,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar40._4_4_ = fStack_2fdc + fStack_2ffc;
      auVar40._0_4_ = local_2fe0 + local_3000;
      auVar40._12_4_ = fStack_2fd4 + fStack_2ff4;
      auVar40._8_4_ = fStack_2fd8 + fStack_2ff8;
      auVar40._20_4_ = fStack_2fcc + fStack_2fec;
      auVar40._16_4_ = fStack_2fd0 + fStack_2ff0;
      auVar40._28_4_ = fStack_2fc4 + fStack_2fe4;
      auVar40._24_4_ = fStack_2fc8 + fStack_2fe8;
      auVar2 = vandps_avx(auVar6,auVar40);
      local_dc0 = auVar6._0_4_;
      uStack_dbc = auVar6._4_4_;
      uStack_db8 = auVar6._8_4_;
      uStack_db4 = auVar6._12_4_;
      uStack_db0 = auVar6._16_4_;
      uStack_dac = auVar6._20_4_;
      uStack_da8 = auVar6._24_4_;
      uStack_da4 = auVar6._28_4_;
      auVar128._0_4_ = local_dc0 ^ auVar10._0_4_;
      auVar128._4_4_ = uStack_dbc ^ auVar10._4_4_;
      auVar128._8_4_ = uStack_db8 ^ auVar10._8_4_;
      auVar128._12_4_ = uStack_db4 ^ auVar10._12_4_;
      auVar128._16_4_ = uStack_db0 ^ auVar10._16_4_;
      auVar128._20_4_ = uStack_dac ^ auVar10._20_4_;
      auVar128._24_4_ = uStack_da8 ^ auVar10._24_4_;
      auVar128._28_4_ = uStack_da4 ^ auVar10._28_4_;
      auVar6 = vandps_avx(auVar128,auVar3);
      auVar6 = vorps_avx(auVar2,auVar6);
      local_3be0 = auVar6._0_8_;
      uStack_3bd8 = auVar6._8_8_;
      uStack_3bd0 = auVar6._16_8_;
      uStack_3bc8 = auVar6._24_8_;
      *local_3ac8 = local_3be0;
      local_3ac8[1] = uStack_3bd8;
      local_3ac8[2] = uStack_3bd0;
      local_3ac8[3] = uStack_3bc8;
      local_3ab8 = local_3ab8 + 1;
      local_3ac0 = local_3ac0 + 2;
      local_3ac8 = local_3ac8 + 4;
    }
    for (; local_3b44 < in_ECX; local_3b44 = local_3b44 + 1) {
      uVar1 = *local_3ac0;
      uVar30 = CONCAT44(uVar1,uVar1);
      uVar31 = CONCAT44(uVar1,uVar1);
      auVar66._8_8_ = uVar31;
      auVar66._0_8_ = uVar30;
      auVar65._8_8_ = uVar31;
      auVar65._0_8_ = uVar30;
      auVar64._8_8_ = uVar31;
      auVar64._0_8_ = uVar30;
      auVar14._8_8_ = uVar31;
      auVar14._0_8_ = uVar30;
      auVar13 = vcmpps_avx(auVar14,ZEXT816(0),4);
      auVar14 = vcmpps_avx(*(undefined1 (*) [16])*local_3ab8,ZEXT816(0),4);
      auVar16 = vpand_avx(auVar13,auVar14);
      auVar18._8_8_ = 0x8000000080000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar17 = vpand_avx(auVar18,auVar64);
      auVar15._8_8_ = 0x8000000080000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar18 = vpand_avx(auVar15,*(undefined1 (*) [16])*local_3ab8);
      auVar13 = vcmpps_avx(auVar65,ZEXT816(0),1);
      auVar15 = vcmpps_avx(*(undefined1 (*) [16])*local_3ab8,ZEXT816(0),1);
      auVar19._8_8_ = 0x8000000080000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar15 = vpand_avx(auVar15,auVar19);
      auVar22._8_8_ = 0x40490fdb40490fdb;
      auVar22._0_8_ = 0x40490fdb40490fdb;
      auVar15 = vpor_avx(auVar15,auVar22);
      auVar19 = vpand_avx(auVar13,auVar15);
      auVar13 = vdivps_avx(*(undefined1 (*) [16])*local_3ab8,auVar66);
      auVar23._8_8_ = 0x8000000080000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar20 = vpand_avx(auVar23,auVar13);
      auVar29._8_8_ = 0x8000000080000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar23 = vpcmpeqd_avx(auVar22,auVar22);
      auVar21 = vpandn_avx(auVar29,auVar13);
      auVar27._8_8_ = 0x3f8000003f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar13 = vcmpps_avx(auVar27,auVar21,1);
      auVar25._8_8_ = 0xbf800000bf800000;
      auVar25._0_8_ = 0xbf800000bf800000;
      auVar15 = vpand_avx(auVar13,auVar25);
      auVar22 = vpandn_avx(auVar13,auVar21);
      auVar22 = vpor_avx(auVar15,auVar22);
      auVar15 = vpand_avx(auVar13,auVar21);
      auVar28._8_8_ = 0x3f8000003f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar21 = vpandn_avx(auVar13,auVar28);
      auVar15 = vpor_avx(auVar15,auVar21);
      auVar15 = vdivps_avx(auVar22,auVar15);
      local_610 = auVar15._0_4_;
      fStack_60c = auVar15._4_4_;
      fStack_608 = auVar15._8_4_;
      fStack_604 = auVar15._12_4_;
      fVar125 = local_610 * local_610;
      fVar129 = fStack_60c * fStack_60c;
      fVar131 = fStack_608 * fStack_608;
      fVar133 = fStack_604 * fStack_604;
      fVar126 = fVar125 * fVar125;
      fVar130 = fVar129 * fVar129;
      fVar132 = fVar131 * fVar131;
      fVar134 = fVar133 * fVar133;
      auVar108._4_4_ = fVar130;
      auVar108._0_4_ = fVar126;
      auVar108._8_4_ = fVar132;
      auVar108._12_4_ = fVar134;
      auVar117._8_8_ = 0xbc83a25cbc83a25c;
      auVar117._0_8_ = 0xbc83a25cbc83a25c;
      auVar119._8_8_ = 0xbd99b01ebd99b01e;
      auVar119._0_8_ = 0xbd99b01ebd99b01e;
      auVar15 = vfmadd213ps_fma(auVar117,auVar108,auVar119);
      auVar109._4_4_ = fVar130;
      auVar109._0_4_ = fVar126;
      auVar109._8_4_ = fVar132;
      auVar109._12_4_ = fVar134;
      auVar121._8_8_ = 0xbe117200be117200;
      auVar121._0_8_ = 0xbe117200be117200;
      auVar15 = vfmadd213ps_fma(auVar15,auVar109,auVar121);
      auVar110._4_4_ = fVar130;
      auVar110._0_4_ = fVar126;
      auVar110._8_4_ = fVar132;
      auVar110._12_4_ = fVar134;
      auVar123._8_8_ = 0xbeaaaa53beaaaa53;
      auVar123._0_8_ = 0xbeaaaa53beaaaa53;
      auVar15 = vfmadd213ps_fma(auVar15,auVar110,auVar123);
      auVar111._4_4_ = fVar130;
      auVar111._0_4_ = fVar126;
      auVar111._8_4_ = fVar132;
      auVar111._12_4_ = fVar134;
      auVar116._8_8_ = 0x3b3ac5373b3ac537;
      auVar116._0_8_ = 0x3b3ac5373b3ac537;
      auVar118._8_8_ = 0x3d2edd4e3d2edd4e;
      auVar118._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar21 = vfmadd213ps_fma(auVar116,auVar111,auVar118);
      auVar112._4_4_ = fVar130;
      auVar112._0_4_ = fVar126;
      auVar112._8_4_ = fVar132;
      auVar112._12_4_ = fVar134;
      auVar120._8_8_ = 0x3dd9ed243dd9ed24;
      auVar120._0_8_ = 0x3dd9ed243dd9ed24;
      auVar21 = vfmadd213ps_fma(auVar21,auVar112,auVar120);
      auVar113._4_4_ = fVar130;
      auVar113._0_4_ = fVar126;
      auVar113._8_4_ = fVar132;
      auVar113._12_4_ = fVar134;
      auVar122._8_8_ = 0x3e4cb9743e4cb974;
      auVar122._0_8_ = 0x3e4cb9743e4cb974;
      auVar21 = vfmadd213ps_fma(auVar21,auVar113,auVar122);
      auVar114._4_4_ = fVar130;
      auVar114._0_4_ = fVar126;
      auVar114._8_4_ = fVar132;
      auVar114._12_4_ = fVar134;
      auVar124._8_8_ = 0x3f8000003f800000;
      auVar124._0_8_ = 0x3f8000003f800000;
      auVar21 = vfmadd213ps_fma(auVar21,auVar114,auVar124);
      auVar115._4_4_ = fVar129;
      auVar115._0_4_ = fVar125;
      auVar115._8_4_ = fVar131;
      auVar115._12_4_ = fVar133;
      auVar15 = vfmadd213ps_fma(auVar15,auVar115,auVar21);
      local_650 = auVar15._0_4_;
      fStack_64c = auVar15._4_4_;
      fStack_648 = auVar15._8_4_;
      fStack_644 = auVar15._12_4_;
      auVar24._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar13 = vpand_avx(auVar13,auVar24);
      local_680 = auVar13._0_4_;
      fStack_67c = auVar13._4_4_;
      fStack_678 = auVar13._8_4_;
      fStack_674 = auVar13._12_4_;
      auVar26._4_4_ = fStack_64c * fStack_60c + fStack_67c;
      auVar26._0_4_ = local_650 * local_610 + local_680;
      auVar26._8_4_ = fStack_648 * fStack_608 + fStack_678;
      auVar26._12_4_ = fStack_644 * fStack_604 + fStack_674;
      auVar13 = vpor_avx(auVar26,auVar20);
      local_b60 = auVar13._0_4_;
      fStack_b5c = auVar13._4_4_;
      fStack_b58 = auVar13._8_4_;
      fStack_b54 = auVar13._12_4_;
      local_b70 = auVar19._0_4_;
      fStack_b6c = auVar19._4_4_;
      fStack_b68 = auVar19._8_4_;
      fStack_b64 = auVar19._12_4_;
      auVar21._8_8_ = 0x40490fdb40490fdb;
      auVar21._0_8_ = 0x40490fdb40490fdb;
      auVar13 = vpor_avx(auVar17,auVar21);
      auVar13 = vcmpps_avx(auVar13,ZEXT816(0),1);
      auVar20._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar20._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar15 = vpor_avx(auVar18,auVar20);
      auVar15 = vpand_avx(auVar14,auVar15);
      auVar17._8_8_ = 0x40490fdb40490fdb;
      auVar17._0_8_ = 0x40490fdb40490fdb;
      auVar17 = vpand_avx(auVar13,auVar17);
      auVar13 = vpandn_avx(auVar13,ZEXT816(0));
      auVar13 = vpor_avx(auVar17,auVar13);
      auVar13 = vpandn_avx(auVar14,auVar13);
      auVar14 = vpor_avx(auVar15,auVar13);
      auVar13._4_4_ = fStack_b5c + fStack_b6c;
      auVar13._0_4_ = local_b60 + local_b70;
      auVar13._12_4_ = fStack_b54 + fStack_b64;
      auVar13._8_4_ = fStack_b58 + fStack_b68;
      auVar13 = vpand_avx(auVar16,auVar13);
      auVar14 = vpand_avx(auVar16 ^ auVar23,auVar14);
      auVar13 = vpor_avx(auVar13,auVar14);
      local_3c10 = auVar13._0_8_;
      uStack_3c08 = auVar13._8_8_;
      *local_3ac8 = local_3c10;
      local_3ac8[1] = uStack_3c08;
      local_3ab8 = (undefined1 (*) [32])(*local_3ab8 + 0x10);
      local_3ac0 = local_3ac0 + 1;
      local_3ac8 = local_3ac8 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}